

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Synth.cpp
# Opt level: O0

bool __thiscall
MT32Emu::Synth::getSoundName(Synth *this,char *soundName,Bit8u timbreGroup,Bit8u timbreNumber)

{
  byte bVar1;
  PaddedTimbre *pPVar2;
  CommonParam *timbreCommon;
  Bit8u timbresInGroup;
  Bit8u timbreNumber_local;
  Bit8u timbreGroup_local;
  char *soundName_local;
  Synth *this_local;
  
  if (((this->opened & 1U) == 0) || (3 < timbreGroup)) {
    this_local._7_1_ = false;
  }
  else {
    if (timbreGroup == '\x03') {
      bVar1 = (byte)this->controlROMMap->timbreRCount;
    }
    else {
      bVar1 = 0x40;
    }
    if (timbreNumber < bVar1) {
      pPVar2 = this->mt32ram->timbres + (int)((uint)timbreGroup * 0x40 + (uint)timbreNumber);
      if ((pPVar2->timbre).common.partialMute == '\0') {
        this_local._7_1_ = false;
      }
      else {
        *(undefined8 *)soundName = *(undefined8 *)(pPVar2->timbre).common.name;
        *(undefined2 *)(soundName + 8) = *(undefined2 *)((pPVar2->timbre).common.name + 8);
        soundName[10] = '\0';
        this_local._7_1_ = true;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Synth::getSoundName(char *soundName, Bit8u timbreGroup, Bit8u timbreNumber) const {
	if (!opened || 3 < timbreGroup) return false;
	Bit8u timbresInGroup = 3 == timbreGroup ? controlROMMap->timbreRCount : 64;
	if (timbresInGroup <= timbreNumber) return false;
	TimbreParam::CommonParam &timbreCommon = mt32ram.timbres[timbreGroup * 64 + timbreNumber].timbre.common;
	if (timbreCommon.partialMute == 0) return false;
	memcpy(soundName, timbreCommon.name, sizeof timbreCommon.name);
	soundName[sizeof timbreCommon.name] = 0;
	return true;
}